

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int on_ack_new_token(quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,
                    quicly_sent_t *sent)

{
  byte *pbVar1;
  ulong uVar2;
  
  if ((sent->data).max_streams.uni != 0) {
    *(int *)&map[5].bytes_in_flight = (int)map[5].bytes_in_flight + -1;
    (sent->data).max_streams.uni = 0;
  }
  if ((acked != 0) && (uVar2 = (sent->data).ack.range.end, map[5].num_packets < uVar2)) {
    map[5].num_packets = uVar2;
  }
  if (((int)map[5].bytes_in_flight == 0) &&
     ((st_quicly_sent_block_t *)map[5].num_packets < map[5].tail)) {
    pbVar1 = (byte *)((long)&map[9]._pending_packet + 4);
    *pbVar1 = *pbVar1 | 0x20;
  }
  return 0;
}

Assistant:

static int on_ack_new_token(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));

    if (sent->data.new_token.is_inflight) {
        --conn->egress.new_token.num_inflight;
        sent->data.new_token.is_inflight = 0;
    }
    if (acked) {
        QUICLY_PROBE(NEW_TOKEN_ACKED, conn, conn->stash.now, sent->data.new_token.generation);
        if (conn->egress.new_token.max_acked < sent->data.new_token.generation)
            conn->egress.new_token.max_acked = sent->data.new_token.generation;
    }

    if (conn->egress.new_token.num_inflight == 0 && conn->egress.new_token.max_acked < conn->egress.new_token.generation)
        conn->egress.pending_flows |= QUICLY_PENDING_FLOW_NEW_TOKEN_BIT;

    return 0;
}